

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::AsmJsByteCodeWriter::TryWriteAsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot value,uint32 slotIndex,ViewType viewType
          )

{
  bool bVar1;
  uint local_2e;
  uint uStack_2a;
  OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> layout;
  ViewType viewType_local;
  uint32 slotIndex_local;
  RegSlot value_local;
  OpCodeAsmJs op_local;
  AsmJsByteCodeWriter *this_local;
  
  layout.SlotIndex._1_1_ = viewType;
  layout._2_4_ = slotIndex;
  unique0x100000a6 = value;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>(&uStack_2a,value);
  if (((bVar1) &&
      (bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<Js::ArrayBufferView::ViewType>
                         ((ViewType *)&layout,layout.SlotIndex._1_1_), bVar1)) &&
     (bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>(&local_2e,layout._2_4_),
     bVar1)) {
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)2>
              (&(this->super_ByteCodeWriter).m_byteCodeData,op,&local_2e,9,
               &this->super_ByteCodeWriter,false);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmTypedArr(OpCodeAsmJs op, RegSlot value, uint32 slotIndex, ArrayBufferView::ViewType viewType)
    {
        OpLayoutT_AsmTypedArr<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Value, value) && SizePolicy::template Assign<ArrayBufferView::ViewType>(layout.ViewType, viewType)
            && SizePolicy::Assign(layout.SlotIndex, slotIndex))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }